

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsystem_netconf.c
# Opt level: O0

int netconf_write(LIBSSH2_CHANNEL *channel,char *buf,size_t len)

{
  ulong uVar1;
  bool local_39;
  long local_38;
  ssize_t wr;
  ssize_t i;
  size_t len_local;
  char *buf_local;
  LIBSSH2_CHANNEL *channel_local;
  
  local_38 = 0;
  do {
    uVar1 = libssh2_channel_write_ex(channel,0,buf,len);
    if ((long)uVar1 < 0) {
      fprintf(_stderr,"libssh2_channel_write: %d\n",uVar1 & 0xffffffff);
      return -1;
    }
    local_38 = uVar1 + local_38;
    local_39 = 0 < (long)uVar1 && local_38 < (long)len;
  } while (local_39);
  return 0;
}

Assistant:

static int netconf_write(LIBSSH2_CHANNEL *channel, const char *buf, size_t len)
{
    ssize_t i;
    ssize_t wr = 0;

    do {
        i = libssh2_channel_write(channel, buf, len);
        if(i < 0) {
            fprintf(stderr, "libssh2_channel_write: %d\n", (int)i);
            return -1;
        }
        wr += i;
    } while(i > 0 && wr < (ssize_t)len);

    return 0;
}